

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O1

Cut_Man_t * Abc_NtkCuts(Abc_Ntk_t *pNtk,Cut_Params_t *pParams)

{
  Abc_Obj_t *pNode;
  int iVar1;
  uint uVar2;
  int iVar3;
  Cut_Man_t *p;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  ProgressBar *p_00;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  Cut_Man_t *pCVar11;
  char *__assertion;
  Abc_Obj_t *pAVar12;
  Cut_Cut_t *pCut;
  uint uVar13;
  timespec ts;
  long local_60;
  timespec local_50;
  int *local_40;
  ulong local_38;
  
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    local_60 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_60 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (pParams->fAdjust != 0) {
    Abc_NtkCutsSubtractFanunt(pNtk);
  }
  nEqual = 0;
  nGood = 0;
  nTotal = 0;
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                  ,0x8d,"Cut_Man_t *Abc_NtkCuts(Abc_Ntk_t *, Cut_Params_t *)");
  }
  pParams->nIdsMax = pNtk->vObjs->nSize;
  p = Cut_ManStart(pParams);
  if ((pParams->fGlobal != 0) || (pParams->fLocal != 0)) {
    pVVar6 = pNtk->vObjs;
    uVar9 = (ulong)pVVar6->nSize;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar3 = (int)(uVar9 + 1);
    iVar1 = 0x10;
    if (0xe < uVar9) {
      iVar1 = iVar3;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar1;
    local_38 = uVar9;
    if (iVar1 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)iVar1 << 2);
    }
    pVVar4->pArray = piVar5;
    pVVar4->nSize = iVar3;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,(uVar9 + 1) * 4);
    }
    if (pVVar6->nSize < 1) {
      uVar10 = 0;
      uVar13 = 0;
    }
    else {
      lVar8 = 0;
      uVar13 = 0;
      uVar10 = 0;
      local_40 = piVar5;
      do {
        pAVar12 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
        if (pAVar12 != (Abc_Obj_t *)0x0) {
          uVar2 = *(uint *)&pAVar12->field_0x14 & 0xf;
          if ((0xfffffffd < uVar2 - 5) &&
             (pNode = (Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray],
             (*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
            iVar1 = Abc_NodeMffcSize(pNode);
            uVar13 = uVar13 + iVar1;
          }
          uVar10 = uVar10 + (uVar2 == 7);
          if ((((*(uint *)&pAVar12->field_0x14 & 0xf) == 7) && (1 < (pAVar12->vFanouts).nSize)) &&
             (iVar1 = Abc_NodeIsMuxControlType(pAVar12), iVar1 == 0)) {
            iVar1 = Abc_NodeMffcSize(pAVar12);
            iVar3 = Abc_NodeMffcSize(pAVar12);
            uVar13 = iVar3 + uVar13;
            if ((2 < iVar1) || (8 < (pAVar12->vFanouts).nSize)) {
              iVar1 = pAVar12->Id;
              if (((long)iVar1 < 0) || ((int)local_38 < iVar1)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              local_40[iVar1] = 1;
            }
          }
        }
        lVar8 = lVar8 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar8 < pVVar6->nSize);
    }
    printf("Total nodes = %d. Total MFFC nodes = %d.\n",(ulong)uVar10,(ulong)uVar13);
    Cut_ManSetNodeAttrs(p,pVVar4);
  }
  if (pParams->fDrop != 0) {
    pVVar4 = Abc_NtkFanoutCounts(pNtk);
    Cut_ManSetFanoutCounts(p,pVVar4);
  }
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      if (0 < *(int *)((long)pVVar6->pArray[lVar8] + 0x2c)) {
        Cut_NodeSetTriv(p,*(int *)((long)pVVar6->pArray[lVar8] + 0x10));
      }
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vCis;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = Abc_AigDfs(pNtk,0,1);
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  p_00 = Extra_ProgressBarStart(_stdout,pVVar6->nSize);
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pAVar12 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
      if ((*(uint *)&pAVar12->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar8)) {
          Extra_ProgressBarUpdate_int(p_00,(int)lVar8,(char *)0x0);
        }
        puVar7 = (uint *)Abc_NodeGetCuts(p,pAVar12,pParams->fDag,pParams->fTree);
        if (pParams->fNpnSave != 0) {
          for (; puVar7 != (uint *)0x0; puVar7 = *(uint **)(puVar7 + 4)) {
            uVar13 = *puVar7;
            if (0x3fffffff < uVar13) {
              Npn_ManSaveOne((uint *)((long)puVar7 + (ulong)(uVar13 >> 0x16 & 0x3c) + 0x18),
                             uVar13 >> 0x1c);
            }
          }
        }
        if (pParams->fDrop != 0) {
          Cut_NodeTryDroppingCuts(p,*(pAVar12->vFanins).pArray);
          Cut_NodeTryDroppingCuts(p,(pAVar12->vFanins).pArray[1]);
        }
        if (((ulong)pAVar12 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002a1d9e:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
        }
        if (pAVar12->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_002a1d9e;
        }
        if (((pAVar12->field_5).pData != (void *)0x0) && (0 < (pAVar12->vFanouts).nSize)) {
          pVVar4->nSize = 0;
          do {
            iVar1 = pAVar12->Id;
            uVar13 = pVVar4->nCap;
            if (pVVar4->nSize == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (pVVar4->pArray == (int *)0x0) {
                  piVar5 = (int *)malloc(0x40);
                }
                else {
                  piVar5 = (int *)realloc(pVVar4->pArray,0x40);
                }
                pVVar4->pArray = piVar5;
                iVar3 = 0x10;
              }
              else {
                iVar3 = uVar13 * 2;
                if (iVar3 <= (int)uVar13) goto LAB_002a1c01;
                if (pVVar4->pArray == (int *)0x0) {
                  piVar5 = (int *)malloc((ulong)uVar13 << 3);
                }
                else {
                  piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar13 << 3);
                }
                pVVar4->pArray = piVar5;
              }
              if (piVar5 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar4->nCap = iVar3;
            }
LAB_002a1c01:
            iVar3 = pVVar4->nSize;
            pVVar4->nSize = iVar3 + 1;
            pVVar4->pArray[iVar3] = iVar1;
            pAVar12 = (Abc_Obj_t *)(pAVar12->field_5).pData;
          } while (pAVar12 != (Abc_Obj_t *)0x0);
          Cut_NodeUnionCuts(p,pVVar4);
        }
      }
      else if (pParams->fDrop != 0) {
        Cut_NodeTryDroppingCuts(p,*(pAVar12->vFanins).pArray);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar6->nSize);
  }
  Extra_ProgressBarStop(p_00);
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  pCVar11 = p;
  Cut_ManPrintStats(p);
  Abc_Print((int)pCVar11,"%s =","TOTAL");
  iVar3 = 3;
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar8 + local_60) / 1000000.0);
  if (nTotal != 0) {
    printf("Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n",(double)nGood / (double)nTotal);
  }
  if (pParams->fAdjust != 0) {
    Abc_NtkCutsAddFanunt(pNtk);
  }
  return p;
}

Assistant:

Cut_Man_t * Abc_NtkCuts( Abc_Ntk_t * pNtk, Cut_Params_t * pParams )
{
    ProgressBar * pProgress;
    Cut_Man_t * p;
    Cut_Cut_t * pList;
    Abc_Obj_t * pObj, * pNode;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vChoices;
    int i;
    abctime clk = Abc_Clock();

    extern void Abc_NtkBalanceAttach( Abc_Ntk_t * pNtk );
    extern void Abc_NtkBalanceDetach( Abc_Ntk_t * pNtk );

    if ( pParams->fAdjust )
    Abc_NtkCutsSubtractFanunt( pNtk );

    nTotal = nGood = nEqual = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the manager
    pParams->nIdsMax = Abc_NtkObjNumMax( pNtk );
    p = Cut_ManStart( pParams );
    // compute node attributes if local or global cuts are requested
    if ( pParams->fGlobal || pParams->fLocal )
    {
        extern Vec_Int_t * Abc_NtkGetNodeAttributes( Abc_Ntk_t * pNtk );
        Cut_ManSetNodeAttrs( p, Abc_NtkGetNodeAttributes(pNtk) );
    }
    // prepare for cut dropping
    if ( pParams->fDrop )
        Cut_ManSetFanoutCounts( p, Abc_NtkFanoutCounts(pNtk) );
    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_NodeSetTriv( p, pObj->Id );
    // compute cuts for internal nodes
    vNodes = Abc_AigDfs( pNtk, 0, 1 ); // collects POs
    vChoices = Vec_IntAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vNodes) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // when we reached a CO, it is time to deallocate the cuts
        if ( Abc_ObjIsCo(pObj) )
        {
            if ( pParams->fDrop )
                Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            continue;
        }
        // skip constant node, it has no cuts
//        if ( Abc_NodeIsConst(pObj) )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // compute the cuts to the internal node
        pList = (Cut_Cut_t *)Abc_NodeGetCuts( p, pObj, pParams->fDag, pParams->fTree );
        if ( pParams->fNpnSave && pList )
        {
            extern void Npn_ManSaveOne( unsigned * puTruth, int nVars );
            Cut_Cut_t * pCut;
            for ( pCut = pList; pCut; pCut = pCut->pNext )
                if ( pCut->nLeaves >= 4 )
                    Npn_ManSaveOne( Cut_CutReadTruth(pCut), pCut->nLeaves );
        }
        // consider dropping the fanins cuts
        if ( pParams->fDrop )
        {
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId1(pObj) );
        }
        // add cuts due to choices
        if ( Abc_AigNodeIsChoice(pObj) )
        {
            Vec_IntClear( vChoices );
            for ( pNode = pObj; pNode; pNode = (Abc_Obj_t *)pNode->pData )
                Vec_IntPush( vChoices, pNode->Id );
            Cut_NodeUnionCuts( p, vChoices );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vChoices );
    Cut_ManPrintStats( p );
ABC_PRT( "TOTAL", Abc_Clock() - clk );
//    printf( "Area = %d.\n", Abc_NtkComputeArea( pNtk, p ) );
//Abc_NtkPrintCuts( p, pNtk, 0 );
//    Cut_ManPrintStatsToFile( p, pNtk->pSpec, Abc_Clock() - clk );

    // temporary printout of stats
    if ( nTotal )
    printf( "Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n", nTotal, nGood, ((double)nGood)/nTotal );
    if ( pParams->fAdjust )
    Abc_NtkCutsAddFanunt( pNtk );
    return p;
}